

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O3

char * CVodeGetReturnFlagName(long flag)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  
  pcVar1 = (char *)malloc(0x18);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1,"CV_SUCCESS",0xb);
    break;
  case 1:
    uVar5._0_1_ = 'C';
    uVar5._1_1_ = 'V';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'T';
    uVar9._0_1_ = 'S';
    uVar9._1_1_ = 'T';
    uVar9._2_1_ = 'O';
    uVar9._3_1_ = 'P';
    uVar13._0_1_ = '_';
    uVar13._1_1_ = 'R';
    uVar13._2_1_ = 'E';
    uVar13._3_1_ = 'T';
    uVar15._0_1_ = 'U';
    uVar15._1_1_ = 'R';
    uVar15._2_1_ = 'N';
    uVar15._3_1_ = '\0';
LAB_00126a78:
    *(undefined4 *)pcVar1 = uVar5;
    *(undefined4 *)(pcVar1 + 4) = uVar9;
    *(undefined4 *)(pcVar1 + 8) = uVar13;
    *(undefined4 *)(pcVar1 + 0xc) = uVar15;
    break;
  case 2:
    builtin_strncpy(pcVar1 + 7,"_RETURN",8);
    uVar2 = 0x5f544f4f525f5643;
LAB_00126b4c:
    *(undefined8 *)pcVar1 = uVar2;
    break;
  default:
    switch(flag) {
    default:
      goto switchD_0012681a_caseD_ffffffd9;
    case -0x6b:
      builtin_strncpy(pcVar1 + 5,"TY_BADT",8);
      uVar2 = 0x5f595445475f5643;
      goto LAB_00126b4c;
    case -0x6a:
      uVar2 = 0x465f4457465f5643;
      goto LAB_00126b71;
    case -0x69:
      builtin_strncpy(pcVar1 + 7,"WD_FAIL",8);
      uVar2 = 0x57464945525f5643;
      goto LAB_00126b4c;
    case -0x68:
      builtin_strncpy(pcVar1,"CV_BAD_TB0",0xb);
      break;
    case -0x67:
      builtin_strncpy(pcVar1,"CV_NO_BCK",10);
      break;
    case -0x66:
      builtin_strncpy(pcVar1,"CV_NO_FWD",10);
      break;
    case -0x65:
      builtin_strncpy(pcVar1,"CV_NO_ADJ",10);
    }
    break;
  case -0x2d:
    builtin_strncpy(pcVar1,"CV_BAD_IS",10);
    break;
  case -0x2c:
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'V';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'U';
    uVar7._0_1_ = 'N';
    uVar7._1_1_ = 'R';
    uVar7._2_1_ = 'E';
    uVar7._3_1_ = 'C';
    uVar11._0_1_ = '_';
    uVar11._1_1_ = 'S';
    uVar11._2_1_ = 'R';
    uVar11._3_1_ = 'H';
    goto LAB_001269f9;
  case -0x2b:
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'V';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'R';
    uVar7._0_1_ = 'E';
    uVar7._1_1_ = 'P';
    uVar7._2_1_ = 'T';
    uVar7._3_1_ = 'D';
    uVar11._0_1_ = '_';
    uVar11._1_1_ = 'S';
    uVar11._2_1_ = 'R';
    uVar11._3_1_ = 'H';
    goto LAB_001269f9;
  case -0x2a:
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'V';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'F';
    uVar7._0_1_ = 'I';
    uVar7._1_1_ = 'R';
    uVar7._2_1_ = 'S';
    uVar7._3_1_ = 'T';
    uVar11._0_1_ = '_';
    uVar11._1_1_ = 'S';
    uVar11._2_1_ = 'R';
    uVar11._3_1_ = 'H';
    goto LAB_001269f9;
  case -0x29:
    uVar4._0_1_ = 'C';
    uVar4._1_1_ = 'V';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'S';
    uVar8._0_1_ = 'R';
    uVar8._1_1_ = 'H';
    uVar8._2_1_ = 'S';
    uVar8._3_1_ = 'F';
    uVar12._0_1_ = 'U';
    uVar12._1_1_ = 'N';
    uVar12._2_1_ = 'C';
    uVar12._3_1_ = '_';
    uVar14._0_1_ = 'F';
    uVar14._1_1_ = 'A';
    uVar14._2_1_ = 'I';
    uVar14._3_1_ = 'L';
    goto LAB_00126a4c;
  case -0x28:
    builtin_strncpy(pcVar1,"CV_NO_SENS",0xb);
    break;
  case -0x27:
  case -0x26:
  case -0x25:
  case -0x24:
  case -0x23:
  case -0x1d:
  case -0x1c:
  case -0x13:
  case -0x12:
  case -0x11:
  case -0xf:
  case -0xe:
  case -0xd:
switchD_0012681a_caseD_ffffffd9:
    builtin_strncpy(pcVar1,"NONE",5);
    break;
  case -0x22:
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'V';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'U';
    uVar7._0_1_ = 'N';
    uVar7._1_1_ = 'R';
    uVar7._2_1_ = 'E';
    uVar7._3_1_ = 'C';
    uVar11._0_1_ = '_';
    uVar11._1_1_ = 'Q';
    uVar11._2_1_ = 'R';
    uVar11._3_1_ = 'H';
    goto LAB_001269f9;
  case -0x21:
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'V';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'R';
    uVar7._0_1_ = 'E';
    uVar7._1_1_ = 'P';
    uVar7._2_1_ = 'T';
    uVar7._3_1_ = 'D';
    uVar11._0_1_ = '_';
    uVar11._1_1_ = 'Q';
    uVar11._2_1_ = 'R';
    uVar11._3_1_ = 'H';
    goto LAB_001269f9;
  case -0x20:
    uVar3._0_1_ = 'C';
    uVar3._1_1_ = 'V';
    uVar3._2_1_ = '_';
    uVar3._3_1_ = 'F';
    uVar7._0_1_ = 'I';
    uVar7._1_1_ = 'R';
    uVar7._2_1_ = 'S';
    uVar7._3_1_ = 'T';
    uVar11._0_1_ = '_';
    uVar11._1_1_ = 'Q';
    uVar11._2_1_ = 'R';
    uVar11._3_1_ = 'H';
LAB_001269f9:
    *(undefined4 *)pcVar1 = uVar3;
    *(undefined4 *)(pcVar1 + 4) = uVar7;
    *(undefined4 *)(pcVar1 + 8) = uVar11;
    pcVar1[0xc] = 'S';
    pcVar1[0xd] = 'F';
    pcVar1[0xe] = 'U';
    pcVar1[0xf] = 'N';
    pcVar1[0xe] = 'U';
    pcVar1[0xf] = 'N';
    pcVar1[0x10] = 'C';
    pcVar1[0x11] = '_';
    pcVar1[0x12] = 'E';
    pcVar1[0x13] = 'R';
    pcVar1[0x14] = 'R';
    pcVar1[0x15] = '\0';
    break;
  case -0x1f:
    uVar4._0_1_ = 'C';
    uVar4._1_1_ = 'V';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'Q';
    uVar8._0_1_ = 'R';
    uVar8._1_1_ = 'H';
    uVar8._2_1_ = 'S';
    uVar8._3_1_ = 'F';
    uVar12._0_1_ = 'U';
    uVar12._1_1_ = 'N';
    uVar12._2_1_ = 'C';
    uVar12._3_1_ = '_';
    uVar14._0_1_ = 'F';
    uVar14._1_1_ = 'A';
    uVar14._2_1_ = 'I';
    uVar14._3_1_ = 'L';
    goto LAB_00126a4c;
  case -0x1e:
    builtin_strncpy(pcVar1,"CV_NO_QUAD",0xb);
    break;
  case -0x1b:
    builtin_strncpy(pcVar1 + 5,"O_CLOSE",8);
    uVar2 = 0x435f4f4f545f5643;
    goto LAB_00126b4c;
  case -0x1a:
    builtin_strncpy(pcVar1,"CV_BAD_DKY",0xb);
    break;
  case -0x19:
    uVar2 = 0x545f4441425f5643;
    goto LAB_00126aa7;
  case -0x18:
    uVar2 = 0x4b5f4441425f5643;
LAB_00126aa7:
    *(undefined8 *)pcVar1 = uVar2;
    pcVar1[8] = '\0';
    break;
  case -0x17:
    builtin_strncpy(pcVar1 + 5,"_MALLOC",8);
    uVar2 = 0x414d5f4f4e5f5643;
    goto LAB_00126b4c;
  case -0x16:
    builtin_strncpy(pcVar1 + 5,"L_INPUT",8);
    uVar2 = 0x495f4c4c495f5643;
    goto LAB_00126b4c;
  case -0x15:
    builtin_strncpy(pcVar1,"CV_MEM_NULL",0xc);
    break;
  case -0x14:
    uVar2 = 0x465f4d454d5f5643;
    goto LAB_00126b71;
  case -0x10:
    uVar2 = 0x465f534c4e5f5643;
LAB_00126b71:
    *(undefined8 *)pcVar1 = uVar2;
    pcVar1[8] = 'A';
    pcVar1[9] = 'I';
    pcVar1[10] = 'L';
    pcVar1[0xb] = '\0';
    break;
  case -0xc:
    builtin_strncpy(pcVar1 + 7,"NC_FAIL",8);
    uVar2 = 0x4e554654525f5643;
    goto LAB_00126b4c;
  case -0xb:
    uVar6._0_1_ = 'C';
    uVar6._1_1_ = 'V';
    uVar6._2_1_ = '_';
    uVar6._3_1_ = 'U';
    uVar10._0_1_ = 'N';
    uVar10._1_1_ = 'R';
    uVar10._2_1_ = 'E';
    uVar10._3_1_ = 'C';
    goto LAB_00126b09;
  case -10:
    uVar6._0_1_ = 'C';
    uVar6._1_1_ = 'V';
    uVar6._2_1_ = '_';
    uVar6._3_1_ = 'R';
    uVar10._0_1_ = 'E';
    uVar10._1_1_ = 'P';
    uVar10._2_1_ = 'T';
    uVar10._3_1_ = 'D';
    goto LAB_00126b09;
  case -9:
    uVar6._0_1_ = 'C';
    uVar6._1_1_ = 'V';
    uVar6._2_1_ = '_';
    uVar6._3_1_ = 'F';
    uVar10._0_1_ = 'I';
    uVar10._1_1_ = 'R';
    uVar10._2_1_ = 'S';
    uVar10._3_1_ = 'T';
LAB_00126b09:
    *(undefined4 *)pcVar1 = uVar6;
    *(undefined4 *)(pcVar1 + 4) = uVar10;
    pcVar1[8] = '_';
    pcVar1[9] = 'R';
    pcVar1[10] = 'H';
    pcVar1[0xb] = 'S';
    pcVar1[0xc] = 'F';
    pcVar1[0xd] = 'U';
    pcVar1[0xe] = 'N';
    pcVar1[0xf] = 'C';
    pcVar1[0xd] = 'U';
    pcVar1[0xe] = 'N';
    pcVar1[0xf] = 'C';
    pcVar1[0x10] = '_';
    pcVar1[0x11] = 'E';
    pcVar1[0x12] = 'R';
    pcVar1[0x13] = 'R';
    pcVar1[0x14] = '\0';
    break;
  case -8:
    uVar5._0_1_ = 'C';
    uVar5._1_1_ = 'V';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'R';
    uVar9._0_1_ = 'H';
    uVar9._1_1_ = 'S';
    uVar9._2_1_ = 'F';
    uVar9._3_1_ = 'U';
    uVar13._0_1_ = 'N';
    uVar13._1_1_ = 'C';
    uVar13._2_1_ = '_';
    uVar13._3_1_ = 'F';
    uVar15._0_1_ = 'A';
    uVar15._1_1_ = 'I';
    uVar15._2_1_ = 'L';
    uVar15._3_1_ = '\0';
    goto LAB_00126a78;
  case -7:
    builtin_strncpy(pcVar1 + 7,"VE_FAIL",8);
    uVar2 = 0x564c4f534c5f5643;
    goto LAB_00126b4c;
  case -6:
    builtin_strncpy(pcVar1 + 7,"UP_FAIL",8);
    uVar2 = 0x555445534c5f5643;
    goto LAB_00126b4c;
  case -5:
    builtin_strncpy(pcVar1 + 6,"IT_FAIL",8);
    uVar2 = 0x54494e494c5f5643;
    goto LAB_00126b4c;
  case -4:
    uVar5._0_1_ = 'C';
    uVar5._1_1_ = 'V';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'C';
    uVar9._0_1_ = 'O';
    uVar9._1_1_ = 'N';
    uVar9._2_1_ = 'V';
    uVar9._3_1_ = '_';
    uVar13._0_1_ = 'F';
    uVar13._1_1_ = 'A';
    uVar13._2_1_ = 'I';
    uVar13._3_1_ = 'L';
    uVar15._0_1_ = 'U';
    uVar15._1_1_ = 'R';
    uVar15._2_1_ = 'E';
    uVar15._3_1_ = '\0';
    goto LAB_00126a78;
  case -3:
    builtin_strncpy(pcVar1 + 7,"FAILURE",8);
    uVar2 = 0x465f5252455f5643;
    goto LAB_00126b4c;
  case -2:
    uVar5._0_1_ = 'C';
    uVar5._1_1_ = 'V';
    uVar5._2_1_ = '_';
    uVar5._3_1_ = 'T';
    uVar9._0_1_ = 'O';
    uVar9._1_1_ = 'O';
    uVar9._2_1_ = '_';
    uVar9._3_1_ = 'M';
    uVar13._0_1_ = 'U';
    uVar13._1_1_ = 'C';
    uVar13._2_1_ = 'H';
    uVar13._3_1_ = '_';
    uVar15._0_1_ = 'A';
    uVar15._1_1_ = 'C';
    uVar15._2_1_ = 'C';
    uVar15._3_1_ = '\0';
    goto LAB_00126a78;
  case -1:
    uVar4._0_1_ = 'C';
    uVar4._1_1_ = 'V';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'T';
    uVar8._0_1_ = 'O';
    uVar8._1_1_ = 'O';
    uVar8._2_1_ = '_';
    uVar8._3_1_ = 'M';
    uVar12._0_1_ = 'U';
    uVar12._1_1_ = 'C';
    uVar12._2_1_ = 'H';
    uVar12._3_1_ = '_';
    uVar14._0_1_ = 'W';
    uVar14._1_1_ = 'O';
    uVar14._2_1_ = 'R';
    uVar14._3_1_ = 'K';
LAB_00126a4c:
    *(undefined4 *)pcVar1 = uVar4;
    *(undefined4 *)(pcVar1 + 4) = uVar8;
    *(undefined4 *)(pcVar1 + 8) = uVar12;
    *(undefined4 *)(pcVar1 + 0xc) = uVar14;
    pcVar1[0x10] = '\0';
  }
  return pcVar1;
}

Assistant:

char* CVodeGetReturnFlagName(long int flag)
{
  char* name;

  name = (char*)malloc(24 * sizeof(char));

  switch (flag)
  {
  case CV_SUCCESS: sprintf(name, "CV_SUCCESS"); break;
  case CV_TSTOP_RETURN: sprintf(name, "CV_TSTOP_RETURN"); break;
  case CV_ROOT_RETURN: sprintf(name, "CV_ROOT_RETURN"); break;
  case CV_TOO_MUCH_WORK: sprintf(name, "CV_TOO_MUCH_WORK"); break;
  case CV_TOO_MUCH_ACC: sprintf(name, "CV_TOO_MUCH_ACC"); break;
  case CV_ERR_FAILURE: sprintf(name, "CV_ERR_FAILURE"); break;
  case CV_CONV_FAILURE: sprintf(name, "CV_CONV_FAILURE"); break;
  case CV_LINIT_FAIL: sprintf(name, "CV_LINIT_FAIL"); break;
  case CV_LSETUP_FAIL: sprintf(name, "CV_LSETUP_FAIL"); break;
  case CV_LSOLVE_FAIL: sprintf(name, "CV_LSOLVE_FAIL"); break;
  case CV_RHSFUNC_FAIL: sprintf(name, "CV_RHSFUNC_FAIL"); break;
  case CV_FIRST_RHSFUNC_ERR: sprintf(name, "CV_FIRST_RHSFUNC_ERR"); break;
  case CV_REPTD_RHSFUNC_ERR: sprintf(name, "CV_REPTD_RHSFUNC_ERR"); break;
  case CV_UNREC_RHSFUNC_ERR: sprintf(name, "CV_UNREC_RHSFUNC_ERR"); break;
  case CV_RTFUNC_FAIL: sprintf(name, "CV_RTFUNC_FAIL"); break;
  case CV_MEM_FAIL: sprintf(name, "CV_MEM_FAIL"); break;
  case CV_MEM_NULL: sprintf(name, "CV_MEM_NULL"); break;
  case CV_ILL_INPUT: sprintf(name, "CV_ILL_INPUT"); break;
  case CV_NO_MALLOC: sprintf(name, "CV_NO_MALLOC"); break;
  case CV_BAD_K: sprintf(name, "CV_BAD_K"); break;
  case CV_BAD_T: sprintf(name, "CV_BAD_T"); break;
  case CV_BAD_DKY: sprintf(name, "CV_BAD_DKY"); break;
  case CV_NO_QUAD: sprintf(name, "CV_NO_QUAD"); break;
  case CV_QRHSFUNC_FAIL: sprintf(name, "CV_QRHSFUNC_FAIL"); break;
  case CV_FIRST_QRHSFUNC_ERR: sprintf(name, "CV_FIRST_QRHSFUNC_ERR"); break;
  case CV_REPTD_QRHSFUNC_ERR: sprintf(name, "CV_REPTD_QRHSFUNC_ERR"); break;
  case CV_UNREC_QRHSFUNC_ERR: sprintf(name, "CV_UNREC_QRHSFUNC_ERR"); break;
  case CV_BAD_IS: sprintf(name, "CV_BAD_IS"); break;
  case CV_NO_SENS: sprintf(name, "CV_NO_SENS"); break;
  case CV_SRHSFUNC_FAIL: sprintf(name, "CV_SRHSFUNC_FAIL"); break;
  case CV_FIRST_SRHSFUNC_ERR: sprintf(name, "CV_FIRST_SRHSFUNC_ERR"); break;
  case CV_REPTD_SRHSFUNC_ERR: sprintf(name, "CV_REPTD_SRHSFUNC_ERR"); break;
  case CV_UNREC_SRHSFUNC_ERR: sprintf(name, "CV_UNREC_SRHSFUNC_ERR"); break;
  case CV_TOO_CLOSE: sprintf(name, "CV_TOO_CLOSE"); break;
  case CV_NO_ADJ: sprintf(name, "CV_NO_ADJ"); break;
  case CV_NO_FWD: sprintf(name, "CV_NO_FWD"); break;
  case CV_NO_BCK: sprintf(name, "CV_NO_BCK"); break;
  case CV_BAD_TB0: sprintf(name, "CV_BAD_TB0"); break;
  case CV_REIFWD_FAIL: sprintf(name, "CV_REIFWD_FAIL"); break;
  case CV_FWD_FAIL: sprintf(name, "CV_FWD_FAIL"); break;
  case CV_GETY_BADT: sprintf(name, "CV_GETY_BADT"); break;
  case CV_NLS_FAIL: sprintf(name, "CV_NLS_FAIL"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}